

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests-records_level.c
# Opt level: O1

void CGTFS_RecordLevel(void)

{
  int iVar1;
  level_t a;
  char *field_names [3];
  char *field_values [3];
  level_t d;
  level_t local_2e0;
  undefined1 local_258 [16];
  char *local_248;
  undefined1 local_1c8 [16];
  char *local_1b8;
  level_t local_138;
  level_t local_b0;
  
  iVar1 = greatest_test_pre("level_read");
  if (iVar1 != 0) {
    iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar1 == 0) {
      local_248 = "level_name";
      local_258._0_8_ = "level_id";
      local_258._8_8_ = "level_index";
      local_1b8 = "Another damn level";
      local_1c8._0_8_ = "INDEX123_abc";
      local_1c8._8_8_ = "0.435";
      read_level(&local_2e0,3,(char **)local_258,(char **)local_1c8);
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = greatest_do_assert_equal_t
                        ("INDEX123_abc",&local_2e0,&greatest_type_info_string,(void *)0x0);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x13;
        if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) {
LAB_001217d2:
          greatest_info.msg = "type_info->equal callback missing!";
        }
        else {
          greatest_info.msg = "\"INDEX123_abc\" != lvl_1.id";
        }
      }
      else {
        greatest_info.assertions = greatest_info.assertions + 1;
        iVar1 = greatest_do_assert_equal_t
                          ("Another damn level",local_2e0.name,&greatest_type_info_string,
                           (void *)0x0);
        if (iVar1 == 0) {
          greatest_info.fail_line = 0x14;
          if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) goto LAB_001217d2;
          greatest_info.msg = "\"Another damn level\" != lvl_1.name";
        }
        else {
          greatest_info.assertions = greatest_info.assertions + 1;
          if ((local_2e0.index == 0.435) && (!NAN(local_2e0.index))) {
            greatest_info.msg = (char *)0x0;
            iVar1 = 0;
            goto LAB_001217f4;
          }
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%f",0x3d70a3d7);
          fwrite("\n     Got: ",0xb,1,_stdout);
          fprintf(_stdout,"%f",local_2e0.index._0_4_);
          fputc(10,_stdout);
          greatest_info.fail_line = 0x15;
          greatest_info.msg = "0.435 != lvl_1.index";
        }
      }
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_level.c"
      ;
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00121a2a;
    }
LAB_001217f4:
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("level_compare");
  if (iVar1 == 0) {
    return;
  }
  iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
  if (iVar1 == 0) {
    memcpy(&local_2e0,"SOMEID123",0x88);
    memcpy((level_t *)local_258,"SOMEID123",0x88);
    memcpy(local_1c8,"SOMEID456",0x88);
    memcpy(&local_b0,"SOMEID123",0x88);
    memcpy(&local_138,"SOMEID123",0x88);
    greatest_info.assertions = greatest_info.assertions + 1;
    iVar1 = equal_level(&local_2e0,(level_t *)local_258);
    if (iVar1 == 1) {
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = equal_level(&local_2e0,(level_t *)local_1c8);
      if (iVar1 == 0) {
        greatest_info.assertions = greatest_info.assertions + 1;
        iVar1 = equal_level((level_t *)local_258,(level_t *)local_1c8);
        if (iVar1 == 0) {
          greatest_info.assertions = greatest_info.assertions + 1;
          iVar1 = equal_level((level_t *)local_258,&local_b0);
          if (iVar1 == 0) {
            greatest_info.assertions = greatest_info.assertions + 1;
            iVar1 = equal_level((level_t *)local_258,&local_138);
            if (iVar1 == 0) {
              greatest_info.msg = (char *)0x0;
              iVar1 = 0;
              goto LAB_0012192b;
            }
            greatest_info.fail_line = 0x3d;
            greatest_info.msg = "0 != equal_level(&b, &e)";
          }
          else {
            greatest_info.fail_line = 0x3c;
            greatest_info.msg = "0 != equal_level(&b, &d)";
          }
        }
        else {
          greatest_info.fail_line = 0x3b;
          greatest_info.msg = "0 != equal_level(&b, &c)";
        }
      }
      else {
        greatest_info.fail_line = 0x3a;
        greatest_info.msg = "0 != equal_level(&a, &c)";
      }
    }
    else {
      greatest_info.fail_line = 0x39;
      greatest_info.msg = "1 != equal_level(&a, &b)";
    }
    greatest_info.fail_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_level.c"
    ;
    iVar1 = -1;
    if ((greatest_info.flags & 4) != 0) {
LAB_00121a2a:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_level.c"
      ;
      abort();
    }
  }
LAB_0012192b:
  greatest_test_post(iVar1);
  return;
}

Assistant:

SUITE(CGTFS_RecordLevel) {
    RUN_TEST(level_read);
    RUN_TEST(level_compare);
}